

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O0

BN * __thiscall BN::expRightToLeft(BN *__return_storage_ptr__,BN *this,BN *exponent,BN *mod)

{
  bool bVar1;
  BN local_e0;
  BN local_c8;
  BN local_b0;
  BN local_98;
  ulong local_80;
  size_t i;
  ushort *local_70;
  bt *curr;
  size_t sStack_60;
  bt mask;
  size_t len;
  undefined1 local_48 [8];
  BN S;
  BN *mod_local;
  BN *exponent_local;
  BN *this_local;
  BN *result;
  
  bVar1 = is0(exponent);
  if (bVar1) {
    bn1();
  }
  else {
    S.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
    bn1();
    operator%((BN *)local_48,this,mod);
    sStack_60 = bitCount(exponent);
    curr._6_2_ = 1;
    i = (size_t)std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin(&exponent->ba);
    local_70 = __gnu_cxx::
               __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
               ::operator*((__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                            *)&i);
    for (local_80 = 0; local_80 < sStack_60; local_80 = local_80 + 1) {
      if (curr._6_2_ == 0) {
        curr._6_2_ = 1;
        local_70 = local_70 + 1;
      }
      if ((*local_70 & curr._6_2_) != 0) {
        operator*(&local_b0,__return_storage_ptr__,(BN *)local_48);
        operator%(&local_98,&local_b0,mod);
        operator=(__return_storage_ptr__,&local_98);
        ~BN(&local_98);
        ~BN(&local_b0);
      }
      if (local_80 + 1 != sStack_60) {
        Qrt(&local_e0,(BN *)local_48);
        operator%(&local_c8,&local_e0,mod);
        operator=((BN *)local_48,&local_c8);
        ~BN(&local_c8);
        ~BN(&local_e0);
      }
      curr._6_2_ = curr._6_2_ << 1;
    }
    S.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
    ~BN((BN *)local_48);
    if ((S.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
      ~BN(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BN BN::expRightToLeft(const BN& exponent, const BN& mod) const {
    if(exponent.is0())
        return BN::bn1();

    BN result(BN::bn1());
    BN S = *this % mod;

    size_t len = exponent.bitCount();
    bt mask = 1;
    const bt *curr = &*exponent.ba.begin();
    for(size_t i = 0; i < len; i++) {
        if(!mask) {
            mask = 1;
            ++curr;
        }
        if(*curr & mask)
            result = move(result * S % mod);

        if (i + 1 != len)
            S = move(S.Qrt() % mod);
        mask <<= 1;
    }
    return result;
}